

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.cpp
# Opt level: O0

void __thiscall
LocalBGValueFunctionVector::~LocalBGValueFunctionVector(LocalBGValueFunctionVector *this)

{
  LocalBGValueFunctionVector *in_RDI;
  
  ~LocalBGValueFunctionVector(in_RDI);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

LocalBGValueFunctionVector::~LocalBGValueFunctionVector()
{
}